

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WritePropertyWithDefault<std::__cxx11::string>
          (Serializer *this,field_id_t field_id,char *tag,
          CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *value,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_value)

{
  __type _Var1;
  byte bVar2;
  
  if ((this->options).serialize_default_values == false) {
    _Var1 = ::std::operator==(&value->value,default_value);
    if (_Var1) {
      bVar2 = 0;
      (*this->_vptr_Serializer[4])(this,(ulong)field_id,tag,0);
      goto LAB_01a6fd0f;
    }
  }
  (*this->_vptr_Serializer[4])(this,(ulong)field_id,tag,1);
  (*this->_vptr_Serializer[0x1c])(this,&value->value);
  bVar2 = 1;
LAB_01a6fd0f:
  (*this->_vptr_Serializer[5])(this,(ulong)bVar2);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const CSVOption<T> &value,
	                              const T &default_value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && (value == default_value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value.GetValue());
		OnOptionalPropertyEnd(true);
	}